

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

EulerAngles * AML::quat2EulerAngles_YZY(EulerAngles *__return_storage_ptr__,Quaternion *quat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double phi_;
  double dVar11;
  double dVar12;
  double psi;
  double theta;
  double phi;
  double m32;
  double m23;
  double m22;
  double m21;
  double m12;
  double x2q0q1;
  double x2q2q3;
  double x2q0q3;
  double x2q1q2;
  double q3_2;
  double q2_2;
  double q1_2;
  double q0_2;
  Quaternion *quat_local;
  
  dVar11 = (quat->field_0).data[0];
  dVar12 = (quat->field_0).data[0];
  dVar1 = (quat->field_0).data[1];
  dVar2 = (quat->field_0).data[1];
  dVar3 = (quat->field_0).data[2];
  dVar4 = (quat->field_0).data[2];
  dVar5 = (quat->field_0).data[3];
  dVar6 = (quat->field_0).data[3];
  dVar7 = (quat->field_0).data[1] * 2.0 * (quat->field_0).data[2];
  dVar8 = (quat->field_0).data[0] * 2.0 * (quat->field_0).data[3];
  dVar9 = (quat->field_0).data[2] * 2.0 * (quat->field_0).data[3];
  dVar10 = (quat->field_0).data[0] * 2.0 * (quat->field_0).data[1];
  phi_ = atan2(dVar9 - dVar10,dVar7 + dVar8);
  dVar11 = acos(((dVar11 * dVar12 - dVar1 * dVar2) + dVar3 * dVar4) - dVar5 * dVar6);
  dVar12 = atan2(dVar9 + dVar10,-(dVar7 - dVar8));
  EulerAngles::EulerAngles(__return_storage_ptr__,phi_,dVar11,dVar12,YZY);
  return __return_storage_ptr__;
}

Assistant:

EulerAngles quat2EulerAngles_YZY(const Quaternion& quat)
    {
        const double q0_2 = quat.q0 * quat.q0;
        const double q1_2 = quat.q1 * quat.q1;
        const double q2_2 = quat.q2 * quat.q2;
        const double q3_2 = quat.q3 * quat.q3;
        const double x2q1q2 = 2.0 * quat.q1 * quat.q2;
        const double x2q0q3 = 2.0 * quat.q0 * quat.q3;
        const double x2q2q3 = 2.0 * quat.q2 * quat.q3;
        const double x2q0q1 = 2.0 * quat.q0 * quat.q1;
        const double m12 = x2q1q2 + x2q0q3;
        const double m21 = x2q1q2 - x2q0q3;
        const double m22 = q0_2 - q1_2 + q2_2 - q3_2;
        const double m23 = x2q2q3 + x2q0q1;
        const double m32 = x2q2q3 - x2q0q1;
        const double phi = atan2(m32, m12);
        const double theta = acos(m22);
        const double psi = atan2(m23, -m21);
        return EulerAngles(phi, theta, psi, EulerAngles::EulerSequence::YZY);
    }